

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_Stop(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  player_t *ppVar1;
  AActor *pAVar2;
  int iVar3;
  TActorIterator<AActor> iterator;
  
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      iVar3 = 0;
    }
    else {
      (it->Vel).Z = 0.0;
      (it->Vel).X = 0.0;
      (it->Vel).Y = 0.0;
      ppVar1 = it->player;
      iVar3 = 1;
      if (ppVar1 != (player_t *)0x0) {
        (ppVar1->Vel).X = 0.0;
        (ppVar1->Vel).Y = 0.0;
      }
    }
  }
  else {
    iterator.super_FActorIterator.base = (AActor *)0x0;
    iVar3 = 0;
    iterator.super_FActorIterator.id = arg0;
    while( true ) {
      pAVar2 = TActorIterator<AActor>::Next(&iterator);
      if (pAVar2 == (AActor *)0x0) break;
      (pAVar2->Vel).Z = 0.0;
      (pAVar2->Vel).X = 0.0;
      (pAVar2->Vel).Y = 0.0;
      ppVar1 = pAVar2->player;
      iVar3 = 1;
      if (ppVar1 != (player_t *)0x0) {
        (ppVar1->Vel).X = 0.0;
        (ppVar1->Vel).Y = 0.0;
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

FUNC(LS_Thing_Stop)
// Thing_Stop(tid)
{
	AActor * target;
	bool ok = false;

	if (arg0==0)
	{
		if (it != NULL)
		{
			it->Vel.Zero();
			if (it->player != NULL) it->player->Vel.Zero();
			ok = true;
		}
	}
	else
	{
		TActorIterator<AActor> iterator (arg0);

		while ( (target = iterator.Next ()) )
		{
			target->Vel.Zero();
			if (target->player != NULL) target->player->Vel.Zero();
			ok = true;
		}
	}
	return ok;
}